

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

StratifiedSampler * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::StratifiedSampler,int&,int&,bool&,int&>
          (polymorphic_allocator<std::byte> *this,int *args,int *args_1,bool *args_2,int *args_3)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  StratifiedSampler *pSVar4;
  
  iVar3 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x30,8);
  pSVar4 = (StratifiedSampler *)CONCAT44(extraout_var,iVar3);
  iVar3 = *args_1;
  bVar1 = *args_2;
  iVar2 = *args_3;
  pSVar4->xPixelSamples = *args;
  pSVar4->yPixelSamples = iVar3;
  pSVar4->seed = iVar2;
  pSVar4->jitter = bVar1;
  (pSVar4->rng).state = 0x853c49e6748fea9b;
  (pSVar4->rng).inc = 0xda3e39cb94b95bdb;
  (pSVar4->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  pSVar4->sampleIndex = 0;
  pSVar4->dimension = 0;
  return pSVar4;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }